

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieloader.cpp
# Opt level: O0

void __thiscall ModelCache::configureCacheSize(ModelCache *this,size_t cacheSize)

{
  mutex_type *in_RSI;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> guard;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  in_RDI[0xc]._M_device = in_RSI;
  if (in_RDI[0xc]._M_device == (mutex_type *)0x0) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<rlottie::internal::model::Composition>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<rlottie::internal::model::Composition>_>_>_>
    ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<rlottie::internal::model::Composition>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<rlottie::internal::model::Composition>_>_>_>
             *)0x17b6c5);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x17b6cf);
  return;
}

Assistant:

void configureCacheSize(size_t cacheSize)
    {
        std::lock_guard<std::mutex> guard(mMutex);
        mcacheSize = cacheSize;

        if (!mcacheSize) mHash.clear();
    }